

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

vector<basisu::vector<basisu::image>_> * __thiscall
basisu::vector<basisu::vector<basisu::image>_>::operator=
          (vector<basisu::vector<basisu::image>_> *this,
          vector<basisu::vector<basisu::image>_> *other)

{
  uint32_t uVar1;
  vector<basisu::image> *in_RSI;
  vector<basisu::image> *in_RDI;
  uint32_t i;
  vector<basisu::image> *pSrc;
  vector<basisu::image> *pDst;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  size_t in_stack_ffffffffffffffd8;
  vector<basisu::vector<basisu::image>_> *in_stack_ffffffffffffffe0;
  vector<basisu::image> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    if (in_RDI->m_capacity < in_RSI->m_size) {
      clear((vector<basisu::vector<basisu::image>_> *)
            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      increase_capacity((vector<basisu::vector<basisu::image>_> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (uint32_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0),
                        SUB81((ulong)in_RDI >> 0x10,0));
    }
    else {
      resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             SUB41((uint)in_stack_ffffffffffffffd4 >> 0x18,0));
    }
    for (uVar1 = in_RSI->m_size; uVar1 != 0; uVar1 = uVar1 - 1) {
      construct<basisu::vector<basisu::image>,basisu::vector<basisu::image>>
                ((vector<basisu::image> *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_RDI);
    }
    in_RDI->m_size = in_RSI->m_size;
    local_8 = in_RDI;
  }
  return (vector<basisu::vector<basisu::image>_> *)local_8;
}

Assistant:

inline vector& operator= (const vector& other)
      {
         if (this == &other)
            return *this;

         if (m_capacity >= other.m_size)
            resize(0);
         else
         {
            clear();
            increase_capacity(other.m_size, false);
         }

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = other.m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }

         m_size = other.m_size;

         return *this;
      }